

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::p_formatter<spdlog::details::null_scoped_padder>::format
          (p_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  int iVar1;
  undefined2 uVar2;
  ulong uVar3;
  
  iVar1 = tm_time->tm_hour;
  uVar3 = (dest->super_buffer<char>).size_ + 2;
  if ((dest->super_buffer<char>).capacity_ < uVar3) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar3);
  }
  uVar2 = 0x4d41;
  if (0xb < iVar1) {
    uVar2 = 0x4d50;
  }
  *(undefined2 *)((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_) = uVar2;
  (dest->super_buffer<char>).size_ = uVar3;
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 2;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_string_view(ampm(tm_time), dest);
    }